

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# OscReceivedElements.cpp
# Opt level: O2

char * __thiscall osc::ReceivedMessageArgument::AsSymbol(ReceivedMessageArgument *this)

{
  undefined8 *puVar1;
  pointer_____offset_0x10___ *ppuVar2;
  
  if (this->typeTagPtr_ == (char *)0x0) {
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar1[1] = "missing argument";
    *puVar1 = &PTR__exception_0019fc98;
    ppuVar2 = &MissingArgumentException::typeinfo;
  }
  else {
    if (*this->typeTagPtr_ == 'S') {
      return this->argumentPtr_;
    }
    puVar1 = (undefined8 *)__cxa_allocate_exception(0x10);
    puVar1[1] = "wrong argument type";
    *puVar1 = &PTR__exception_0019fcc0;
    ppuVar2 = &WrongArgumentTypeException::typeinfo;
  }
  __cxa_throw(puVar1,ppuVar2,std::exception::~exception);
}

Assistant:

const char* ReceivedMessageArgument::AsSymbol() const
{
    if( !typeTagPtr_ )
        throw MissingArgumentException();
	else if( *typeTagPtr_ == SYMBOL_TYPE_TAG )
		return argumentPtr_;
	else
		throw WrongArgumentTypeException();
}